

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

StmtNode * __thiscall Parser::StmtAUX(Parser *this)

{
  uint uVar1;
  ExpNode *pEVar2;
  undefined **ppuVar3;
  StmtNode *pSVar4;
  StmtNode *catchStmt;
  SwitchNode *this_00;
  CaseBlockNode *block;
  int expectedToken;
  
  switch(this->tok) {
  case 10:
  case 0xe:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x26:
  case 0x2c:
  case 0x2d:
  case 0x36:
  case 0x37:
  case 0x38:
    pEVar2 = ExprAssign(this);
    goto LAB_0010ccb6;
  default:
    Sync(this,this->tok,stmtAUXFollowSet);
    return (StmtNode *)0x0;
  case 0x12:
    Eat(this,0x12);
    EatOrSkip(this,0xe,stmtAUXFollowSet);
    pEVar2 = ExprAssign(this);
    EatOrSkip(this,0xf,stmtAUXFollowSet);
    this_00 = (SwitchNode *)operator_new(0x28);
    pSVar4 = Stmt(this);
    WhileNode::WhileNode((WhileNode *)this_00,pEVar2,pSVar4);
    break;
  case 0x15:
    Eat(this,0x15);
    EatOrSkip(this,0xe,stmtAUXFollowSet);
    pEVar2 = ExprAssign(this);
    EatOrSkip(this,0xf,stmtAUXFollowSet);
    EatOrSkip(this,0x24,stmtAUXFollowSet);
    block = CaseBlock(this);
    EatOrSkip(this,0x25,stmtAUXFollowSet);
    this_00 = (SwitchNode *)operator_new(0x28);
    SwitchNode::SwitchNode(this_00,pEVar2,block);
    break;
  case 0x16:
    Eat(this,0x16);
    pEVar2 = (ExpNode *)operator_new(0x18);
    (pEVar2->super_StmtNode).super_ASTNode._vptr_ASTNode = (_func_int **)0x0;
    *(undefined8 *)&(pEVar2->super_StmtNode).super_ASTNode.line = 0;
    (pEVar2->super_StmtNode).stmt = (ASTNode *)0x0;
    (pEVar2->super_StmtNode).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_00124278;
    uVar1 = lexical_analyzer_getLine();
    (*(pEVar2->super_StmtNode).super_ASTNode._vptr_ASTNode[2])(pEVar2,(ulong)uVar1);
LAB_0010ccb6:
    expectedToken = 0x11;
LAB_0010ccc5:
    EatOrSkip(this,expectedToken,stmtAUXFollowSet);
    return &pEVar2->super_StmtNode;
  case 0x17:
    Eat(this,0x17);
    pEVar2 = ExprAssign(this);
    EatOrSkip(this,0x11,stmtAUXFollowSet);
    this_00 = (SwitchNode *)operator_new(0x20);
    ppuVar3 = &PTR__ReturnNode_00124368;
    goto LAB_0010cfa2;
  case 0x18:
    Eat(this,0x18);
    EatOrSkip(this,0xe,stmtAUXFollowSet);
    pEVar2 = (ExpNode *)0x0;
    if (((ulong)(uint)this->tok < 0x39) &&
       ((0x1c03047c0004400U >> ((ulong)(uint)this->tok & 0x3f) & 1) != 0)) {
      pEVar2 = (ExpNode *)ExprListTail(this);
    }
    EatOrSkip(this,0xf,stmtAUXFollowSet);
    EatOrSkip(this,0x11,stmtAUXFollowSet);
    this_00 = (SwitchNode *)operator_new(0x20);
    ppuVar3 = &PTR__PrintNode_001242c8;
    goto LAB_0010cfa2;
  case 0x19:
    Eat(this,0x19);
    EatOrSkip(this,0xe,stmtAUXFollowSet);
    pEVar2 = ExprAssign(this);
    EatOrSkip(this,0xf,stmtAUXFollowSet);
    EatOrSkip(this,0x11,stmtAUXFollowSet);
    this_00 = (SwitchNode *)operator_new(0x20);
    ppuVar3 = &PTR__ReadLnNode_00124318;
LAB_0010cfa2:
    (this_00->super_StmtNode).super_ASTNode._vptr_ASTNode = (_func_int **)ppuVar3;
    this_00->exp = pEVar2;
    break;
  case 0x1a:
    Eat(this,0x1a);
    EatOrSkip(this,0x11,stmtAUXFollowSet);
    this_00 = (SwitchNode *)operator_new(0x18);
    (this_00->super_StmtNode).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001243b8;
    break;
  case 0x1b:
    Eat(this,0x1b);
    pSVar4 = Stmt(this);
    EatOrSkip(this,0x1c,stmtAUXFollowSet);
    EatOrSkip(this,0xe,stmtAUXFollowSet);
    EatOrSkip(this,0x23,stmtAUXFollowSet);
    EatOrSkip(this,0x23,stmtAUXFollowSet);
    EatOrSkip(this,0x23,stmtAUXFollowSet);
    EatOrSkip(this,0xf,stmtAUXFollowSet);
    catchStmt = Stmt(this);
    this_00 = (SwitchNode *)operator_new(0x28);
    TryNode::TryNode((TryNode *)this_00,pSVar4,catchStmt);
    break;
  case 0x24:
    Eat(this,0x24);
    pEVar2 = (ExpNode *)StmtList(this);
    expectedToken = 0x25;
    goto LAB_0010ccc5;
  }
  uVar1 = lexical_analyzer_getLine();
  (*(this_00->super_StmtNode).super_ASTNode._vptr_ASTNode[2])(this_00,(ulong)uVar1);
  return &this_00->super_StmtNode;
}

Assistant:

StmtNode *Parser::StmtAUX() {
    switch (tok) {
        case WHILE: {
            Eat(WHILE);

            EatOrSkip(LPARENT, stmtAUXFollowSet);
            ExpNode *exp = ExprAssign();
            EatOrSkip(RPARENT, stmtAUXFollowSet);

            WhileNode *aux = new WhileNode(exp, Stmt());
            aux->setLine(lexical_analyzer_getLine());

            return aux;
        }
        case SWITCH: {
            Eat(SWITCH);

            EatOrSkip(LPARENT, stmtAUXFollowSet);
            ExpNode *exp = ExprAssign();
            EatOrSkip(RPARENT, stmtAUXFollowSet);

            EatOrSkip(LBRACE, stmtAUXFollowSet);
            CaseBlockNode *cbNode = CaseBlock();
            EatOrSkip(RBRACE, stmtAUXFollowSet);

            SwitchNode *aux = new SwitchNode(exp, cbNode);
            aux->setLine(lexical_analyzer_getLine());

            return aux;
        }
        case BREAK: {
            Eat(BREAK);

            BreakNode *breakNode = new BreakNode();
            breakNode->setLine(lexical_analyzer_getLine());

            EatOrSkip(SEMICOLON, stmtAUXFollowSet);

            return breakNode;
        }
        case PRINT: {
            Eat(PRINT);

            EatOrSkip(LPARENT, stmtAUXFollowSet);
            ExpListNode *expList = ExprList();
            EatOrSkip(RPARENT, stmtAUXFollowSet);

            EatOrSkip(SEMICOLON, stmtAUXFollowSet);

            PrintNode *print = new PrintNode(expList);
            print->setLine(lexical_analyzer_getLine());


            return print;
        }
        case READLN: {
            Eat(READLN);

            EatOrSkip(LPARENT, stmtAUXFollowSet);
            ExpNode *exp = ExprAssign();
            EatOrSkip(RPARENT, stmtAUXFollowSet);

            EatOrSkip(SEMICOLON, stmtAUXFollowSet);

            ReadLnNode *readLnNode = new ReadLnNode(exp);
            readLnNode->setLine(lexical_analyzer_getLine());


            return readLnNode;
        }
        case RETURN: {
            Eat(RETURN);
            ExpNode *exp = ExprAssign();
            EatOrSkip(SEMICOLON, stmtAUXFollowSet);

            ReturnNode *returnNode = new ReturnNode(exp);
            returnNode->setLine(lexical_analyzer_getLine());


            return returnNode;
        }
        case THROW: {
            Eat(THROW);
            EatOrSkip(SEMICOLON, stmtAUXFollowSet);

            ThrowNode *throwNode = new ThrowNode;
            throwNode->setLine(lexical_analyzer_getLine());


            return throwNode;
        }
        case LBRACE: {
            Eat(LBRACE);
            StmtListNode *stmtList = StmtList();
            EatOrSkip(RBRACE, stmtAUXFollowSet);



            return stmtList;
        }
        case TRY: {
            Eat(TRY);
            StmtNode *tryStmt = Stmt();
            EatOrSkip(CATCH, stmtAUXFollowSet);
            EatOrSkip(LPARENT, stmtAUXFollowSet);

            EatOrSkip(DOT, stmtAUXFollowSet);
            EatOrSkip(DOT, stmtAUXFollowSet);
            EatOrSkip(DOT, stmtAUXFollowSet);

            EatOrSkip(RPARENT, stmtAUXFollowSet);
            StmtNode *exception = Stmt();

            TryNode *tryNode = new TryNode(tryStmt, exception);
            tryNode->setLine(lexical_analyzer_getLine());

            return tryNode;
        }
        case NOT:
        case PLUS:
        case MINUS:
        case ID:
        case STAR:
        case ADDRESS:
        case NUMINT:
        case NUMFLOAT:
        case LITERAL:
        case LITERALCHAR:
        case TRUE:
        case FALSE:
        case LPARENT: {
            ExpNode *exp = ExprAssign();
            EatOrSkip(SEMICOLON, stmtAUXFollowSet);

            return exp;
        }
        default: {
            Sync(tok, stmtAUXFollowSet);
        }
    }
    return nullptr;
}